

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::EndResultVerifier::operator()
          (EndResultVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  undefined4 uVar1;
  anon_union_4_2_947300a4 aVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CubeFace face;
  deUint32 value;
  TextureFormat *pTVar6;
  char *__s;
  float *pfVar7;
  MessageBuilder *pMVar8;
  TestLog *pTVar9;
  Vector<int,_3> (*arr) [5];
  int (*arr_00) [5];
  int (*arr_01) [5];
  float fVar10;
  bool local_cb2;
  byte local_cb1;
  Vector<int,_3> *local_c28;
  string local_be8;
  string local_bc8;
  Vector<int,_2> local_ba8;
  MessageBuilder local_ba0;
  MessageBuilder local_a20;
  int local_8a0;
  bool local_899;
  int i_2;
  bool matchFound;
  string local_878;
  Vector<int,_2> local_858;
  MessageBuilder local_850;
  MessageBuilder local_6d0;
  MessageBuilder local_550;
  MessageBuilder local_3d0;
  int local_250;
  float local_24c;
  int i_1;
  int reference;
  IVec3 gid;
  int i;
  int atomicArgs [5];
  undefined1 local_218 [8];
  IVec3 invocationGlobalIDs [5];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [24];
  anon_union_4_2_947300a4 result;
  int x;
  int y;
  byte local_17b;
  byte local_17a;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  LogImage local_c8;
  Vector<int,_2> local_38;
  IVec2 dispatchSizeXY;
  bool isIntegerFormat;
  int sliceOrFaceNdx_local;
  ConstPixelBufferAccess *resultSlice_local;
  TestLog *log_local;
  EndResultVerifier *this_local;
  
  dispatchSizeXY.m_data[1] = sliceOrFaceNdx;
  pTVar6 = tcu::ConstPixelBufferAccess::getFormat(resultSlice);
  dispatchSizeXY.m_data[0]._3_1_ = isFormatTypeInteger(pTVar6->type);
  iVar4 = tcu::ConstPixelBufferAccess::getWidth(resultSlice);
  iVar5 = tcu::ConstPixelBufferAccess::getHeight(resultSlice);
  tcu::Vector<int,_2>::Vector(&local_38,iVar4 * 5,iVar5);
  de::toString<int>(&local_108,dispatchSizeXY.m_data + 1);
  std::operator+(&local_e8,"EndResults",&local_108);
  local_17a = 0;
  local_17b = 0;
  x._3_1_ = 0;
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    face = glslImageFuncZToCubeFace(dispatchSizeXY.m_data[1]);
    value = cubeFaceToGLFace(face);
    __s = glu::getCubeMapFaceName(value);
    std::allocator<char>::allocator();
    local_17a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,__s,&local_179);
    local_17b = 1;
    std::operator+(&local_158,"face ",&local_178);
  }
  else {
    de::toString<int>((string *)&y,dispatchSizeXY.m_data + 1);
    x._3_1_ = 1;
    std::operator+(&local_158,"slice ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y);
  }
  std::operator+(&local_138,"Result Values, ",&local_158);
  tcu::LogImage::LogImage(&local_c8,&local_e8,&local_138,resultSlice,QP_IMAGE_COMPRESSION_MODE_BEST)
  ;
  tcu::TestLog::operator<<(log,&local_c8);
  tcu::LogImage::~LogImage(&local_c8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  if ((x._3_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&y);
  }
  if ((local_17b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_178);
  }
  if ((local_17a & 1) != 0) {
    std::allocator<char>::~allocator(&local_179);
  }
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  result.i = 0;
  do {
    aVar2 = result;
    iVar4 = tcu::ConstPixelBufferAccess::getHeight(resultSlice);
    if (iVar4 <= aVar2.i) {
      return true;
    }
    for (local_1c0._20_4_ = 0; uVar1 = local_1c0._20_4_,
        iVar4 = tcu::ConstPixelBufferAccess::getWidth(resultSlice), (int)uVar1 < iVar4;
        local_1c0._20_4_ = local_1c0._20_4_ + 1) {
      if ((dispatchSizeXY.m_data[0]._3_1_ & 1) == 0) {
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)local_1d0,(int)resultSlice,local_1c0._20_4_,result.i);
        pfVar7 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_1d0);
        local_1c0._16_4_ = *pfVar7;
      }
      else {
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)local_1c0,(int)resultSlice,local_1c0._20_4_,result.i);
        pfVar7 = (float *)tcu::Vector<int,_4>::x((Vector<int,_4> *)local_1c0);
        local_1c0._16_4_ = *pfVar7;
      }
      local_c28 = (Vector<int,_3> *)local_218;
      do {
        tcu::Vector<int,_3>::Vector(local_c28);
        local_c28 = local_c28 + 1;
      } while (local_c28 != (Vector<int,_3> *)(invocationGlobalIDs[4].m_data + 1));
      for (gid.m_data[1] = 0; uVar1 = local_1c0._20_4_, iVar4 = gid.m_data[1], gid.m_data[1] < 5;
          gid.m_data[1] = gid.m_data[1] + 1) {
        iVar5 = tcu::ConstPixelBufferAccess::getWidth(resultSlice);
        tcu::Vector<int,_3>::Vector
                  ((Vector<int,_3> *)&i_1,uVar1 + iVar4 * iVar5,result.i,dispatchSizeXY.m_data[1]);
        *(undefined8 *)(invocationGlobalIDs[(long)gid.m_data[1] + -1].m_data + 1) = _i_1;
        invocationGlobalIDs[gid.m_data[1]].m_data[0] = gid.m_data[0];
        iVar4 = getAtomicFuncArgument(this->m_operation,(IVec3 *)&i_1,&local_38);
        gid.m_data[(long)gid.m_data[1] + 2] = iVar4;
      }
      bVar3 = isOrderIndependentAtomicOperation(this->m_operation);
      if (bVar3) {
        local_24c = (float)getOperationInitialValue(this->m_operation);
        for (local_250 = 0; local_250 < 5; local_250 = local_250 + 1) {
          local_24c = (float)computeBinaryAtomicOperationResult
                                       (this->m_operation,(int)local_24c,
                                        gid.m_data[(long)local_250 + 2]);
        }
        if ((float)local_1c0._16_4_ != local_24c) {
          tcu::TestLog::operator<<(&local_850,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_850,(char (*) [33])"// Failure: end result at pixel ");
          tcu::Vector<int,_2>::Vector(&local_858,local_1c0._20_4_,result.i);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_858);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [22])" of current layer is ");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)(local_1c0 + 0x10));
          pTVar9 = tcu::MessageBuilder::operator<<
                             (pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_6d0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_6d0,
                              (char (*) [52])"// Note: relevant shader invocation global IDs are ");
          arrayStr<tcu::Vector<int,3>,5>(&local_878,(Functional *)local_218,arr);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_878);
          pTVar9 = tcu::MessageBuilder::operator<<
                             (pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_550,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_550,
                              (char (*) [49])"// Note: data expression values for the IDs are ");
          arrayStr<int,5>((string *)&i_2,(Functional *)(gid.m_data + 2),arr_00);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&i_2);
          pTVar9 = tcu::MessageBuilder::operator<<
                             (pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_3d0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_3d0,(char (*) [29])"// Note: reference value is ");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)&local_24c);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3d0);
          std::__cxx11::string::~string((string *)&i_2);
          tcu::MessageBuilder::~MessageBuilder(&local_550);
          std::__cxx11::string::~string((string *)&local_878);
          tcu::MessageBuilder::~MessageBuilder(&local_6d0);
          tcu::MessageBuilder::~MessageBuilder(&local_850);
          return false;
        }
      }
      else if (this->m_operation == ATOMIC_OPERATION_EXCHANGE) {
        local_899 = false;
        local_8a0 = 0;
        while( true ) {
          local_cb1 = 0;
          if (local_8a0 < 5) {
            local_cb1 = local_899 ^ 0xff;
          }
          if ((local_cb1 & 1) == 0) break;
          if ((dispatchSizeXY.m_data[0]._3_1_ & 1) == 0) {
            fVar10 = de::abs<float>((float)local_1c0._16_4_ - (float)gid.m_data[(long)local_8a0 + 2]
                                   );
            local_cb2 = fVar10 <= 0.01;
          }
          else {
            local_cb2 = local_1c0._16_4_ == gid.m_data[(long)local_8a0 + 2];
          }
          local_899 = local_cb2;
          local_8a0 = local_8a0 + 1;
        }
        if (local_899 == false) {
          tcu::TestLog::operator<<(&local_ba0,log,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_ba0,(char (*) [36])"// Failure: invalid value at pixel ");
          tcu::Vector<int,_2>::Vector(&local_ba8,local_1c0._20_4_,result.i);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_ba8);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [7])0xf1a17d);
          if ((dispatchSizeXY.m_data[0]._3_1_ & 1) == 0) {
            de::toString<float>(&local_bc8,(float *)(local_1c0 + 0x10));
          }
          else {
            de::toString<int>(&local_bc8,(int *)(local_1c0 + 0x10));
          }
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_bc8);
          pTVar9 = tcu::MessageBuilder::operator<<
                             (pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_a20,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (&local_a20,(char (*) [26])"// Note: expected one of ");
          arrayStr<int,5>(&local_be8,(Functional *)(gid.m_data + 2),arr_01);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_be8);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_be8);
          tcu::MessageBuilder::~MessageBuilder(&local_a20);
          std::__cxx11::string::~string((string *)&local_bc8);
          tcu::MessageBuilder::~MessageBuilder(&local_ba0);
          return false;
        }
      }
    }
    result.i = result.i + 1;
  } while( true );
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool		isIntegerFormat		= isFormatTypeInteger(resultSlice.getFormat().type);
		const IVec2		dispatchSizeXY		(NUM_INVOCATIONS_PER_PIXEL*resultSlice.getWidth(), resultSlice.getHeight());

		log << TestLog::Image("EndResults" + toString(sliceOrFaceNdx),
							  "Result Values, " + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																				   : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < resultSlice.getWidth(); x++)
		{
			union
			{
				int		i;
				float	f;
			} result;

			if (isIntegerFormat)
				result.i = resultSlice.getPixelInt(x, y).x();
			else
				result.f = resultSlice.getPixel(x, y).x();

			// Compute the arguments that were given to the atomic function in the invocations that contribute to this pixel.

			IVec3	invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			int		atomicArgs[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec3 gid(x + i*resultSlice.getWidth(), y, sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				atomicArgs[i]			= getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
			}

			if (isOrderIndependentAtomicOperation(m_operation))
			{
				// Just accumulate the atomic args (and the initial value) according to the operation, and compare.

				DE_ASSERT(isIntegerFormat);

				int reference = getOperationInitialValue(m_operation);

				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
					reference = computeBinaryAtomicOperationResult(m_operation, reference, atomicArgs[i]);

				if (result.i != reference)
				{
					log << TestLog::Message << "// Failure: end result at pixel " << IVec2(x, y) << " of current layer is " << result.i << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: data expression values for the IDs are " << arrayStr(atomicArgs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: reference value is " << reference << TestLog::EndMessage;
					return false;
				}
			}
			else if (m_operation == ATOMIC_OPERATION_EXCHANGE)
			{
				// Check that the end result equals one of the atomic args.

				bool matchFound = false;

				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL && !matchFound; i++)
					matchFound = isIntegerFormat ? result.i == atomicArgs[i]
												 : de::abs(result.f - (float)atomicArgs[i]) <= 0.01f;

				if (!matchFound)
				{
					log << TestLog::Message << "// Failure: invalid value at pixel " << IVec2(x, y) << ": got " << (isIntegerFormat ? toString(result.i) : toString(result.f)) << TestLog::EndMessage
											<< TestLog::Message << "// Note: expected one of " << arrayStr(atomicArgs) << TestLog::EndMessage;

					return false;
				}
			}
			else
				DE_ASSERT(false);
		}

		return true;
	}